

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O0

void duckdb::ParquetDecodeUtils::BitUnpackAlignedInternal<unsigned_long>
               (ByteBuffer *src,unsigned_long *dst,idx_t count,bitpacking_width_t width)

{
  uint64_t uVar1;
  byte in_CL;
  ulong in_RDX;
  unsigned_long *in_RSI;
  ByteBuffer *in_RDI;
  unsigned_long aligned_data [32];
  idx_t next_read;
  idx_t i;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  bitpacking_width_t in_stack_fffffffffffffebf;
  data_ptr_t in_stack_fffffffffffffec0;
  data_ptr_t in_stack_fffffffffffffec8;
  data_ptr_t in_stack_fffffffffffffed0;
  ulong local_28;
  unsigned_long *local_10;
  
  uVar1 = cast_pointer_to_uint64<unsigned_char>(in_RDI->ptr);
  if ((uVar1 & 7) == 0) {
    data_ptr_cast<unsigned_long>(in_RSI);
    BitpackingPrimitives::UnPackBuffer<unsigned_long>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebf,(bool)in_stack_fffffffffffffebe);
    ByteBuffer::unsafe_inc(in_RDI,(in_RDX * in_CL) / 8);
  }
  else {
    local_10 = in_RSI;
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 0x20) {
      FastMemcpy(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (size_t)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 = data_ptr_cast<unsigned_long>(local_10);
      data_ptr_cast<unsigned_long>((unsigned_long *)&stack0xfffffffffffffec8);
      BitpackingPrimitives::UnPackBlock<unsigned_long>
                (in_stack_fffffffffffffec0,
                 (data_ptr_t)
                 CONCAT17(in_stack_fffffffffffffebf,
                          CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)),'\0',false)
      ;
      ByteBuffer::unsafe_inc(in_RDI,SUB168((ZEXT116(in_CL) << 5) / ZEXT116(8),0));
      local_10 = local_10 + 0x20;
    }
  }
  return;
}

Assistant:

static void BitUnpackAlignedInternal(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		D_ASSERT(count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
		if (cast_pointer_to_uint64(src.ptr) % sizeof(T) == 0) {
			// Fast path: aligned
			BitpackingPrimitives::UnPackBuffer<T>(data_ptr_cast(dst), src.ptr, count, width);
			src.unsafe_inc(count * width / BITPACK_DLEN);
			return;
		}

		for (idx_t i = 0; i < count; i += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			const auto next_read = BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE * width / BITPACK_DLEN;

			// Buffer for alignment
			T aligned_data[BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE];

			// Copy over to aligned buffer
			FastMemcpy(aligned_data, src.ptr, next_read);

			// Unpack
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(dst), data_ptr_cast(aligned_data), width, true);

			src.unsafe_inc(next_read);
			dst += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}